

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

OBSOLETE_length_format ON_DimStyle::OBSOLETE_LengthFormatFromUnsigned(uint format_as_unsigned)

{
  OBSOLETE_length_format local_9;
  uint format_as_unsigned_local;
  
  switch(format_as_unsigned) {
  case 0:
    local_9 = Decimal;
    break;
  case 1:
    local_9 = Fractional;
    break;
  case 2:
    local_9 = FeetInches;
    break;
  case 3:
    local_9 = FeetDecimalInches;
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
               ,0x1e9,"","invalid format_as_unsigned parameter.");
    local_9 = Decimal;
  }
  return local_9;
}

Assistant:

ON_DimStyle::OBSOLETE_length_format ON_DimStyle::OBSOLETE_LengthFormatFromUnsigned(
  unsigned int format_as_unsigned
  )
{
  switch (format_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::OBSOLETE_length_format::Decimal);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::OBSOLETE_length_format::Fractional);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::OBSOLETE_length_format::FeetInches);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::OBSOLETE_length_format::FeetDecimalInches);
  }
  ON_ERROR("invalid format_as_unsigned parameter.");
  return (ON_DimStyle::OBSOLETE_length_format::Decimal);
}